

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O3

ssize_t __thiscall DomColor::write(DomColor *this,int __fd,void *__buf,size_t __n)

{
  uint uVar1;
  undefined4 in_register_00000034;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar2;
  long in_FS_OFFSET;
  QAnyStringView QVar3;
  QAnyStringView QVar4;
  QAnyStringView QVar5;
  QAnyStringView QVar6;
  QAnyStringView QVar7;
  QAnyStringView QVar8;
  QAnyStringView QVar9;
  QAnyStringView QVar10;
  QAnyStringView QVar11;
  QString local_40;
  long local_28;
  
  aVar2._4_4_ = in_register_00000034;
  aVar2._0_4_ = __fd;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)((long)__buf + 0x10) == 0) {
    local_40.d.d = (Data *)0x0;
    local_40.d.ptr = L"color";
    local_40.d.size = 5;
  }
  else {
    QString::toLower_helper(&local_40);
  }
  QVar7.m_size = (size_t)local_40.d.ptr;
  QVar7.field_0.m_data = aVar2.m_data;
  QXmlStreamWriter::writeStartElement(QVar7);
  if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (this->m_has_attr_alpha == true) {
    QString::number((int)&local_40,this->m_attr_alpha);
    QVar3.m_size = (size_t)local_40.d.ptr;
    QVar3.field_0.m_data = (void *)0x8000000000000005;
    QVar8.m_size = (size_t)L"alpha";
    QVar8.field_0.m_data = aVar2.m_data;
    QXmlStreamWriter::writeAttribute(QVar8,QVar3);
    if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  uVar1 = this->m_children;
  if ((uVar1 & 1) != 0) {
    QString::number((int)&local_40,this->m_red);
    QVar4.m_size = (size_t)local_40.d.ptr;
    QVar4.field_0 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)(void *)0x8000000000000003;
    QVar9.m_size = (size_t)L"red";
    QVar9.field_0.m_data = aVar2.m_data;
    QXmlStreamWriter::writeTextElement(QVar9,QVar4);
    if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
      }
    }
    uVar1 = this->m_children;
  }
  if ((uVar1 & 2) != 0) {
    QString::number((int)&local_40,this->m_green);
    QVar5.m_size = (size_t)local_40.d.ptr;
    QVar5.field_0.m_data = (void *)0x8000000000000005;
    QVar10.m_size = (size_t)L"green";
    QVar10.field_0.m_data = aVar2.m_data;
    QXmlStreamWriter::writeTextElement(QVar10,QVar5);
    if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
      }
    }
    uVar1 = this->m_children;
  }
  if ((uVar1 & 4) != 0) {
    QString::number((int)&local_40,this->m_blue);
    QVar6.m_size = (size_t)local_40.d.ptr;
    QVar6.field_0.m_data = (void *)0x8000000000000004;
    QVar11.m_size = (size_t)L"blue";
    QVar11.field_0.m_data = aVar2.m_data;
    QXmlStreamWriter::writeTextElement(QVar11,QVar6);
    if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  QXmlStreamWriter::writeEndElement();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return *(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void DomColor::write(QXmlStreamWriter &writer, const QString &tagName) const
{
    writer.writeStartElement(tagName.isEmpty() ? QStringLiteral("color") : tagName.toLower());

    if (hasAttributeAlpha())
        writer.writeAttribute(u"alpha"_s, QString::number(attributeAlpha()));

    if (m_children & Red)
        writer.writeTextElement(u"red"_s, QString::number(m_red));

    if (m_children & Green)
        writer.writeTextElement(u"green"_s, QString::number(m_green));

    if (m_children & Blue)
        writer.writeTextElement(u"blue"_s, QString::number(m_blue));

    writer.writeEndElement();
}